

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O0

int dwarf_get_die_address_size(Dwarf_Die die,Dwarf_Half *ret_addr_size,Dwarf_Error *error)

{
  Dwarf_Debug pDVar1;
  Dwarf_Debug ckdi_dbg;
  Dwarf_Half address_size;
  Dwarf_Error *error_local;
  Dwarf_Half *ret_addr_size_local;
  Dwarf_Die die_local;
  
  if (die == (Dwarf_Die)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x34);
    die_local._4_4_ = 1;
  }
  else if (die->di_cu_context == (Dwarf_CU_Context_conflict)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x68);
    die_local._4_4_ = 1;
  }
  else {
    pDVar1 = die->di_cu_context->cc_dbg;
    if ((pDVar1 == (Dwarf_Debug)0x0) || (pDVar1->de_magic != 0xebfdebfd)) {
      _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                          "DW_DLE_DBG_NULL: accesing a cu context, Dwarf_Debug either null or it containsa stale Dwarf_Debug pointer"
                         );
      die_local._4_4_ = 1;
    }
    else {
      *ret_addr_size = (ushort)die->di_cu_context->cc_address_size;
      die_local._4_4_ = 0;
    }
  }
  return die_local._4_4_;
}

Assistant:

int
dwarf_get_die_address_size(Dwarf_Die die,
    Dwarf_Half * ret_addr_size, Dwarf_Error *error)
{
    Dwarf_Half address_size = 0;
    CHECK_DIE(die, DW_DLV_ERROR);
    address_size = die->di_cu_context->cc_address_size;
    *ret_addr_size = address_size;
    return DW_DLV_OK;
}